

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Stress::anon_unknown_0::FramebufferRenderCase::init
          (FramebufferRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *pNVar6;
  int iVar7;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar5 = CONCAT44(extraout_var,iVar3);
  if (*(int *)&(this->super_RenderCase).field_0x84 != 5) {
LAB_01066773:
    RenderCase::init(&this->super_RenderCase,ctx);
    switch(*(undefined4 *)&(this->super_RenderCase).field_0x84) {
    case 0:
      local_1b0._0_8_ =
           ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Using default framebuffer.",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      iVar3 = std::ios_base::~ios_base(local_138);
      return iVar3;
    case 1:
      iVar7 = 0x1908;
      iVar3 = 0x1401;
      break;
    case 2:
      iVar7 = 0x1908;
      iVar3 = 0x8033;
      break;
    case 3:
      iVar7 = 0x1908;
      iVar3 = 0x8034;
      break;
    case 4:
      iVar7 = 0x1907;
      iVar3 = 0x8363;
      break;
    case 5:
      iVar7 = 0x1908;
      iVar3 = 0x8d61;
      break;
    default:
      iVar3 = 0;
      iVar7 = 0;
    }
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Creating fbo. Texture internalFormat = ",0x27);
    local_1c0.m_getName = glu::getTextureFormatName;
    local_1c0.m_value = iVar7;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", format = ",0xb);
    local_1d0.m_getName = glu::getTextureFormatName;
    local_1d0.m_value = iVar7;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", type = ",9);
    local_1e0.m_getName = glu::getTypeName;
    local_1e0.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar5 + 0x6f8))(1,&this->m_texID);
    (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texID);
    (**(code **)(lVar5 + 0x1310))(0xde1,0,iVar7,0x100,0x100,0,iVar7,iVar3,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"texture init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x1c2);
    (**(code **)(lVar5 + 0x6d0))(1,&this->m_fboID);
    (**(code **)(lVar5 + 0x78))(0x8d40,this->m_fboID);
    (**(code **)(lVar5 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_texID,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"fbo init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                    ,0x1c8);
    iVar3 = (**(code **)(lVar5 + 0x170))(0x8d40);
    if (iVar3 == 0x8cd5) {
      return 0x8cd5;
    }
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"could not create fbo for testing.","");
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_RenderCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_texture_half_float");
  if (bVar2) {
    ctx = (EVP_PKEY_CTX *)0x1ce794b;
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_RenderCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_color_buffer_half_float");
    if (bVar2) goto LAB_01066773;
  }
  pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"Color renderable half float texture required.","");
  tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
  __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FramebufferRenderCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// check requirements
	if (m_fboType == FBO_RGBA_FLOAT16)
	{
		// half float texture is allowed (OES_texture_half_float) and it is color renderable (EXT_color_buffer_half_float)
		if (!m_context.getContextInfo().isExtensionSupported("GL_OES_texture_half_float") ||
			!m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_half_float"))
			throw tcu::NotSupportedError("Color renderable half float texture required.");
	}

	// gen shader
	RenderCase::init();

	// create render target
	if (m_fboType == FBO_DEFAULT)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Using default framebuffer." << tcu::TestLog::EndMessage;
	}
	else
	{
		GLuint internalFormat	= 0;
		GLuint format			= 0;
		GLuint type				= 0;

#if !defined(GL_HALF_FLOAT_OES)
#	define	GL_HALF_FLOAT_OES 0x8D61
#endif

		switch (m_fboType)
		{
			case FBO_RGBA:			internalFormat = GL_RGBA;	format = GL_RGBA;	type = GL_UNSIGNED_BYTE;				break;
			case FBO_RGBA4:			internalFormat = GL_RGBA;	format = GL_RGBA;	type = GL_UNSIGNED_SHORT_4_4_4_4;		break;
			case FBO_RGB5_A1:		internalFormat = GL_RGBA;	format = GL_RGBA;	type = GL_UNSIGNED_SHORT_5_5_5_1;		break;
			case FBO_RGB565:		internalFormat = GL_RGB;	format = GL_RGB;	type = GL_UNSIGNED_SHORT_5_6_5;			break;
			case FBO_RGBA_FLOAT16:	internalFormat = GL_RGBA;	format = GL_RGBA;	type = GL_HALF_FLOAT_OES;				break;

			default:
				DE_ASSERT(false);
				break;
		}

		m_testCtx.getLog() << tcu::TestLog::Message
			<< "Creating fbo. Texture internalFormat = " << glu::getTextureFormatStr(internalFormat)
			<< ", format = " << glu::getTextureFormatStr(format)
			<< ", type = " << glu::getTypeStr(type)
			<< tcu::TestLog::EndMessage;

		// gen texture
		gl.genTextures(1, &m_texID);
		gl.bindTexture(GL_TEXTURE_2D, m_texID);
		gl.texImage2D(GL_TEXTURE_2D, 0, internalFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, 0, format, type, DE_NULL);
		GLU_EXPECT_NO_ERROR(gl.getError(), "texture init");

		// gen fbo
		gl.genFramebuffers(1, &m_fboID);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texID, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "fbo init");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::NotSupportedError("could not create fbo for testing.");
	}
}